

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# omptarget.cpp
# Opt level: O0

int target_data_update(DeviceTy *Device,int32_t arg_num,void **args_base,void **args,
                      int64_t *arg_sizes,int64_t *arg_types)

{
  bool bVar1;
  int32_t iVar2;
  pointer ppVar3;
  long in_RCX;
  int in_ESI;
  mutex *in_RDI;
  long in_R8;
  long in_R9;
  void **ShadowHstPtrAddr_1;
  iterator it_1;
  uintptr_t ub_1;
  uintptr_t lb_1;
  int rt_1;
  void **ShadowHstPtrAddr;
  iterator it;
  uintptr_t ub;
  uintptr_t lb;
  int rt;
  void *TgtPtrBegin;
  bool IsLast;
  int64_t MapSize;
  void *HstPtrBegin;
  int32_t i;
  map<void_*,_ShadowPtrValTy,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ShadowPtrValTy>_>_>
  *in_stack_ffffffffffffff28;
  mutex *in_stack_ffffffffffffff30;
  void *in_stack_ffffffffffffff38;
  DeviceTy *in_stack_ffffffffffffff40;
  _Self local_b8;
  iterator in_stack_ffffffffffffff50;
  DeviceTy *in_stack_ffffffffffffff58;
  DeviceTy *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  int32_t in_stack_ffffffffffffff6c;
  DeviceTy *in_stack_ffffffffffffff70;
  _Self local_88;
  _Self local_80;
  DeviceTy *local_78;
  DeviceTy *local_70;
  int32_t local_64;
  void *local_60;
  long local_50;
  DeviceTy *local_48;
  int local_3c;
  long local_38;
  long local_30;
  long local_28;
  int local_14;
  mutex *local_10;
  
  local_3c = 0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  do {
    if (local_14 <= local_3c) {
      return 0;
    }
    if (((*(ulong *)(local_38 + (long)local_3c * 8) & 0x100) == 0) &&
       ((*(ulong *)(local_38 + (long)local_3c * 8) & 0x80) == 0)) {
      local_48 = *(DeviceTy **)(local_28 + (long)local_3c * 8);
      local_50 = *(long *)(local_30 + (long)local_3c * 8);
      local_60 = DeviceTy::getTgtPtrBegin
                           (in_stack_ffffffffffffff70,
                            (void *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                            (int64_t)in_stack_ffffffffffffff60,(bool *)in_stack_ffffffffffffff58,
                            SUB81((ulong)in_stack_ffffffffffffff50._M_node >> 0x38,0));
      if (local_60 != (void *)0x0) {
        if ((*(ulong *)(local_38 + (long)local_3c * 8) & 2) != 0) {
          local_64 = DeviceTy::data_retrieve
                               (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                                in_stack_ffffffffffffff30,(int64_t)in_stack_ffffffffffffff28);
          if (local_64 != 0) {
            return -1;
          }
          local_70 = local_48;
          local_78 = (DeviceTy *)((long)&local_48->DeviceID + local_50);
          std::mutex::lock(in_stack_ffffffffffffff30);
          local_80._M_node =
               (_Base_ptr)
               std::
               map<void_*,_ShadowPtrValTy,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ShadowPtrValTy>_>_>
               ::begin(in_stack_ffffffffffffff28);
          while( true ) {
            local_88._M_node =
                 (_Base_ptr)
                 std::
                 map<void_*,_ShadowPtrValTy,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ShadowPtrValTy>_>_>
                 ::end(in_stack_ffffffffffffff28);
            bVar1 = std::operator!=(&local_80,&local_88);
            if (!bVar1) break;
            ppVar3 = std::_Rb_tree_iterator<std::pair<void_*const,_ShadowPtrValTy>_>::operator->
                               ((_Rb_tree_iterator<std::pair<void_*const,_ShadowPtrValTy>_> *)
                                0x114d6c);
            in_stack_ffffffffffffff70 = (DeviceTy *)ppVar3->first;
            if (local_70 <= in_stack_ffffffffffffff70) {
              if (local_78 <= in_stack_ffffffffffffff70) break;
              ppVar3 = std::_Rb_tree_iterator<std::pair<void_*const,_ShadowPtrValTy>_>::operator->
                                 ((_Rb_tree_iterator<std::pair<void_*const,_ShadowPtrValTy>_> *)
                                  0x114d9a);
              *(void **)in_stack_ffffffffffffff70 = (ppVar3->second).HstPtrVal;
            }
            std::_Rb_tree_iterator<std::pair<void_*const,_ShadowPtrValTy>_>::operator++
                      ((_Rb_tree_iterator<std::pair<void_*const,_ShadowPtrValTy>_> *)
                       in_stack_ffffffffffffff30);
          }
          std::mutex::unlock((mutex *)0x114dc6);
        }
        if ((*(ulong *)(local_38 + (long)local_3c * 8) & 1) != 0) {
          in_stack_ffffffffffffff6c =
               DeviceTy::data_submit
                         (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                          in_stack_ffffffffffffff30,(int64_t)in_stack_ffffffffffffff28);
          if (in_stack_ffffffffffffff6c != 0) {
            return -1;
          }
          in_stack_ffffffffffffff58 = (DeviceTy *)((long)&local_48->DeviceID + local_50);
          in_stack_ffffffffffffff60 = local_48;
          std::mutex::lock(in_stack_ffffffffffffff30);
          in_stack_ffffffffffffff50 =
               std::
               map<void_*,_ShadowPtrValTy,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ShadowPtrValTy>_>_>
               ::begin(in_stack_ffffffffffffff28);
          while( true ) {
            local_b8._M_node =
                 (_Base_ptr)
                 std::
                 map<void_*,_ShadowPtrValTy,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ShadowPtrValTy>_>_>
                 ::end(in_stack_ffffffffffffff28);
            bVar1 = std::operator!=((_Self *)&stack0xffffffffffffff50,&local_b8);
            if (!bVar1) break;
            ppVar3 = std::_Rb_tree_iterator<std::pair<void_*const,_ShadowPtrValTy>_>::operator->
                               ((_Rb_tree_iterator<std::pair<void_*const,_ShadowPtrValTy>_> *)
                                0x114ea9);
            in_stack_ffffffffffffff40 = (DeviceTy *)ppVar3->first;
            if (in_stack_ffffffffffffff60 <= in_stack_ffffffffffffff40) {
              if (in_stack_ffffffffffffff58 <= in_stack_ffffffffffffff40) break;
              in_stack_ffffffffffffff30 = local_10;
              ppVar3 = std::_Rb_tree_iterator<std::pair<void_*const,_ShadowPtrValTy>_>::operator->
                                 ((_Rb_tree_iterator<std::pair<void_*const,_ShadowPtrValTy>_> *)
                                  0x114eea);
              in_stack_ffffffffffffff38 = (ppVar3->second).TgtPtrAddr;
              std::_Rb_tree_iterator<std::pair<void_*const,_ShadowPtrValTy>_>::operator->
                        ((_Rb_tree_iterator<std::pair<void_*const,_ShadowPtrValTy>_> *)0x114efd);
              iVar2 = DeviceTy::data_submit
                                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                                 in_stack_ffffffffffffff30,(int64_t)in_stack_ffffffffffffff28);
              if (iVar2 != 0) {
                std::mutex::unlock((mutex *)0x114f3b);
                return -1;
              }
              in_stack_ffffffffffffff6c = 0;
            }
            std::_Rb_tree_iterator<std::pair<void_*const,_ShadowPtrValTy>_>::operator++
                      ((_Rb_tree_iterator<std::pair<void_*const,_ShadowPtrValTy>_> *)
                       in_stack_ffffffffffffff30);
          }
          std::mutex::unlock((mutex *)0x114f6d);
        }
      }
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

int target_data_update(DeviceTy &Device, int32_t arg_num,
    void **args_base, void **args, int64_t *arg_sizes, int64_t *arg_types) {
  // process each input.
  for (int32_t i = 0; i < arg_num; ++i) {
    if ((arg_types[i] & OMP_TGT_MAPTYPE_LITERAL) ||
        (arg_types[i] & OMP_TGT_MAPTYPE_PRIVATE))
      continue;

    void *HstPtrBegin = args[i];
    int64_t MapSize = arg_sizes[i];
    bool IsLast;
    void *TgtPtrBegin = Device.getTgtPtrBegin(HstPtrBegin, MapSize, IsLast,
        false);
    if (!TgtPtrBegin) {
      DP("hst data:" DPxMOD " not found, becomes a noop\n", DPxPTR(HstPtrBegin));
      continue;
    }

    if (arg_types[i] & OMP_TGT_MAPTYPE_FROM) {
      DP("Moving %" PRId64 " bytes (tgt:" DPxMOD ") -> (hst:" DPxMOD ")\n",
          arg_sizes[i], DPxPTR(TgtPtrBegin), DPxPTR(HstPtrBegin));
      int rt = Device.data_retrieve(HstPtrBegin, TgtPtrBegin, MapSize);
      if (rt != OFFLOAD_SUCCESS) {
        DP("Copying data from device failed.\n");
        return OFFLOAD_FAIL;
      }

      uintptr_t lb = (uintptr_t) HstPtrBegin;
      uintptr_t ub = (uintptr_t) HstPtrBegin + MapSize;
      Device.ShadowMtx.lock();
      for (ShadowPtrListTy::iterator it = Device.ShadowPtrMap.begin();
          it != Device.ShadowPtrMap.end(); ++it) {
        void **ShadowHstPtrAddr = (void**) it->first;
        if ((uintptr_t) ShadowHstPtrAddr < lb)
          continue;
        if ((uintptr_t) ShadowHstPtrAddr >= ub)
          break;
        DP("Restoring original host pointer value " DPxMOD " for host pointer "
            DPxMOD "\n", DPxPTR(it->second.HstPtrVal),
            DPxPTR(ShadowHstPtrAddr));
        *ShadowHstPtrAddr = it->second.HstPtrVal;
      }
      Device.ShadowMtx.unlock();
    }

    if (arg_types[i] & OMP_TGT_MAPTYPE_TO) {
      DP("Moving %" PRId64 " bytes (hst:" DPxMOD ") -> (tgt:" DPxMOD ")\n",
          arg_sizes[i], DPxPTR(HstPtrBegin), DPxPTR(TgtPtrBegin));
      int rt = Device.data_submit(TgtPtrBegin, HstPtrBegin, MapSize);
      if (rt != OFFLOAD_SUCCESS) {
        DP("Copying data to device failed.\n");
        return OFFLOAD_FAIL;
      }
      uintptr_t lb = (uintptr_t) HstPtrBegin;
      uintptr_t ub = (uintptr_t) HstPtrBegin + MapSize;
      Device.ShadowMtx.lock();
      for (ShadowPtrListTy::iterator it = Device.ShadowPtrMap.begin();
          it != Device.ShadowPtrMap.end(); ++it) {
        void **ShadowHstPtrAddr = (void**) it->first;
        if ((uintptr_t) ShadowHstPtrAddr < lb)
          continue;
        if ((uintptr_t) ShadowHstPtrAddr >= ub)
          break;
        DP("Restoring original target pointer value " DPxMOD " for target "
            "pointer " DPxMOD "\n", DPxPTR(it->second.TgtPtrVal),
            DPxPTR(it->second.TgtPtrAddr));
        rt = Device.data_submit(it->second.TgtPtrAddr,
            &it->second.TgtPtrVal, sizeof(void *));
        if (rt != OFFLOAD_SUCCESS) {
          DP("Copying data to device failed.\n");
          Device.ShadowMtx.unlock();
          return OFFLOAD_FAIL;
        }
      }
      Device.ShadowMtx.unlock();
    }
  }
  return OFFLOAD_SUCCESS;
}